

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool flatbuffers::StringToNumber<unsigned_long>(char *str,uint64_t *val)

{
  bool bVar1;
  unsigned_long uVar2;
  char *local_38;
  byte local_29;
  char *local_28;
  char *s;
  uint64_t *val_local;
  char *str_local;
  
  bVar1 = StringToIntegerImpl<unsigned_long>(val,str,0,true);
  if (bVar1) {
    local_28 = str;
    if (*val != 0) {
      while( true ) {
        local_29 = 0;
        if (*local_28 != '\0') {
          bVar1 = is_digit(*local_28);
          local_29 = bVar1 ^ 0xff;
        }
        if ((local_29 & 1) == 0) break;
        local_28 = local_28 + 1;
      }
      if (str < local_28) {
        local_38 = local_28 + -1;
      }
      else {
        local_38 = local_28;
      }
      if (*local_38 == '-') {
        uVar2 = std::numeric_limits<unsigned_long>::max();
        *val = uVar2;
        return false;
      }
    }
    str_local._7_1_ = true;
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

inline bool StringToNumber<uint64_t>(const char *str, uint64_t *val) {
  if (!StringToIntegerImpl(val, str)) return false;
  // The strtoull accepts negative numbers:
  // If the minus sign was part of the input sequence, the numeric value
  // calculated from the sequence of digits is negated as if by unary minus
  // in the result type, which applies unsigned integer wraparound rules.
  // Fix this behaviour (except -0).
  if (*val) {
    auto s = str;
    while (*s && !is_digit(*s)) s++;
    s = (s > str) ? (s - 1) : s;  // step back to one symbol
    if (*s == '-') {
      // For unsigned types return the max to distinguish from
      // "no conversion can be performed".
      *val = (flatbuffers::numeric_limits<uint64_t>::max)();
      return false;
    }
  }
  return true;
}